

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O2

void __thiscall
OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath
          (PolylineSegmentedPath *this,size_type numOfPoints,Vec3 *newPoints,bool closedCycle)

{
  allocator_type local_3b;
  allocator_type local_3a;
  allocator_type local_39;
  vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *local_38;
  
  (this->super_SegmentedPath).super_Path._vptr_Path =
       (_func_int **)&PTR__PolylineSegmentedPath_00174c08;
  std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::vector(&this->points_,0,&local_39)
  ;
  local_38 = &this->points_;
  std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::vector
            (&this->segmentTangents_,0,&local_3a);
  std::vector<float,_std::allocator<float>_>::vector(&this->segmentLengths_,0,&local_3b);
  this->closedCycle_ = closedCycle;
  setPath(this,numOfPoints,newPoints,closedCycle);
  return;
}

Assistant:

OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath( size_type numOfPoints,
                                                         Vec3 const newPoints[],
                                                         bool closedCycle )
    : points_( 0 ), segmentTangents_( 0 ), segmentLengths_( 0 ), closedCycle_( closedCycle )
{
        setPath( numOfPoints, newPoints, closedCycle );
}